

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt1
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  void *pvVar1;
  byte bVar2;
  params *ppVar3;
  uint8 *puVar4;
  void *pvVar5;
  ulong uVar6;
  color_quad_u8 *pcVar7;
  ushort uVar8;
  undefined1 *puVar9;
  short sVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 *puVar14;
  ushort uVar15;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint64 s;
  long lVar20;
  ushort uVar21;
  int iVar22;
  long lVar23;
  uint c;
  uint uVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint i;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  uint uVar34;
  uint uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  uint uVar41;
  uint uVar44;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint iterations;
  vector<unsigned_int> solutions;
  uint64 hist [4];
  uint64 d [3];
  color_quad_u8 block_colors [4];
  uint64 DD [4] [3];
  uint64 D2 [4] [3];
  ushort local_1c0;
  ushort local_1bc;
  uint local_1b0;
  int local_190;
  elemental_vector local_188;
  dxt_endpoint_refiner *local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  ulong local_148;
  ulong local_140;
  long local_138 [4];
  undefined1 local_118 [16];
  color_quad_u8 local_108 [4];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar16;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  
  uVar34 = (uint)(low_color->m_s[1] * 64.0);
  uVar35 = (uint)(high_color->m_s[0] * 32.0);
  uVar41 = -(uint)((int)uVar34 < 0x3f);
  uVar44 = -(uint)((int)uVar35 < 0x1f);
  uVar41 = ~uVar41 & 0x3f | uVar34 & uVar41;
  uVar34 = ~uVar44 & 0x1f | uVar35 & uVar44;
  uVar34 = -(uint)(0 < (int)uVar34) & uVar34;
  auVar39._0_4_ = (-(uint)(0 < (int)uVar41) & uVar41) << 5;
  auVar40._4_4_ = uVar34 << 5;
  auVar40._0_4_ = auVar39._0_4_;
  auVar40._8_4_ = auVar40._4_4_;
  auVar40._12_4_ = uVar34 << 0xb;
  auVar39._8_8_ = auVar40._8_8_;
  auVar39._4_4_ = uVar34 << 0xb;
  uVar34 = (uint)(low_color->m_s[0] * 32.0);
  uVar35 = (uint)(high_color->m_s[1] * 64.0);
  uVar41 = -(uint)((int)uVar34 < 0x1f);
  uVar44 = -(uint)((int)uVar35 < 0x3f);
  uVar41 = ~uVar41 & 0x1f | uVar34 & uVar41;
  uVar34 = ~uVar44 & 0x3f | uVar35 & uVar44;
  uVar34 = -(uint)(0 < (int)uVar34) & uVar34;
  auVar37._0_4_ = (-(uint)(0 < (int)uVar41) & uVar41) << 0xb;
  auVar38._4_4_ = uVar34 << 0xb;
  auVar38._0_4_ = auVar37._0_4_;
  auVar38._8_4_ = auVar38._4_4_;
  auVar38._12_4_ = uVar34 << 5;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._4_4_ = uVar34 << 5;
  auVar43._0_4_ = (int)(low_color->m_s[2] * 32.0);
  auVar43._4_4_ = (int)(high_color->m_s[2] * 32.0);
  auVar43._8_8_ = 0;
  auVar42._0_4_ = -(uint)(auVar43._0_4_ < (int)DAT_001b7780);
  auVar42._4_4_ = -(uint)(auVar43._4_4_ < DAT_001b7780._4_4_);
  auVar42._8_4_ = -(uint)(0 < DAT_001b7780._8_4_);
  auVar42._12_4_ = -(uint)(0 < DAT_001b7780._12_4_);
  auVar43 = ~auVar42 & _DAT_001b7780 | auVar43 & auVar42;
  auVar36._0_4_ = -(uint)(0 < auVar43._0_4_);
  auVar36._4_4_ = -(uint)(0 < auVar43._4_4_);
  auVar36._8_4_ = -(uint)(0 < auVar43._8_4_);
  auVar36._12_4_ = -(uint)(0 < auVar43._12_4_);
  auVar43 = auVar36 & auVar43 | auVar37 | auVar39;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  ppVar3 = this->m_pParams;
  uVar34 = ppVar3->m_num_pixels;
  if ((ulong)uVar34 == 0) {
    local_158._8_8_ = 0;
    local_168._8_8_ = 0;
    local_158._0_8_ = 0;
    local_168._0_8_ = 0;
  }
  else {
    pcVar7 = ppVar3->m_pPixels;
    puVar4 = ppVar3->m_pSelectors;
    uVar13 = 0;
    do {
      bVar2 = puVar4[uVar13];
      *(long *)(local_168 + (ulong)bVar2 * 8) = *(long *)(local_168 + (ulong)bVar2 * 8) + 1;
      lVar20 = (ulong)bVar2 * 0x18;
      lVar23 = 0;
      do {
        bVar2 = (pcVar7->field_0).c[lVar23];
        *(ulong *)(local_98 + lVar23 * 8 + lVar20) =
             *(long *)(local_98 + lVar23 * 8 + lVar20) + (ulong)((uint)bVar2 * 2);
        *(ulong *)(local_f8 + lVar23 * 8 + lVar20) =
             *(long *)(local_f8 + lVar23 * 8 + lVar20) + (ulong)bVar2 * (ulong)bVar2;
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      uVar13 = uVar13 + 1;
      pcVar7 = pcVar7 + 1;
    } while (uVar13 != uVar34);
  }
  local_140 = local_158._8_8_ + local_168._8_8_;
  local_148 = local_158._0_8_ + local_168._0_8_;
  local_118 = pshuflw(auVar43,auVar43,0xe8);
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  local_170 = this;
  elemental_vector::increase_capacity(&local_188,0x36,false,4,(object_mover)0x0,false);
  memset((void *)((ulong)local_188.m_size * 4 + (long)local_188.m_p),0,
         (ulong)(0x36 - local_188.m_size) << 2);
  local_188.m_size = 0x36;
  local_190 = 8;
  do {
    local_1b0 = local_118._0_4_ & 0xffff;
    uVar34 = local_118._0_4_ & 0x1f;
    uVar13 = 0;
    sVar10 = (short)uVar34;
    uVar21 = sVar10 - 1;
    if (sVar10 == 0) {
      uVar21 = 0;
    }
    uVar8 = local_118._2_2_;
    uVar35 = (uint)uVar8;
    pvVar5 = local_188.m_p;
    if (uVar21 <= (ushort)(sVar10 + 1U)) {
      uVar44 = local_1b0 >> 5 & 0x3f;
      uVar13 = 0;
      sVar10 = (short)uVar44;
      uVar41 = (uint)(ushort)(sVar10 - 1);
      if (sVar10 == 0) {
        uVar41 = 0;
      }
      sVar16 = (short)(local_1b0 >> 0xb);
      uVar15 = sVar16 + -1 + (ushort)(local_1b0 < 0x800);
      uVar24 = ((uint)uVar8 * 0x10000 + (uint)uVar15 * 0x800 | uVar41 << 5) + (uint)uVar21;
      uVar11 = (uVar41 << 5 | (uint)uVar15 * 0x800) + (uint)uVar21;
      iVar18 = local_1b0 - uVar11;
      uVar17 = (uint)uVar21;
      do {
        local_1c0 = (ushort)uVar41;
        uVar12 = uVar11;
        iVar19 = iVar18;
        uVar30 = uVar41;
        uVar25 = uVar24;
        if (local_1c0 <= (ushort)(sVar10 + 1U)) {
          do {
            uVar32 = uVar13;
            uVar28 = (uint)uVar15;
            iVar22 = iVar19;
            uVar31 = uVar12;
            uVar29 = uVar25;
            if (uVar15 < 0x20 && uVar15 <= (ushort)(sVar16 + 1U)) {
              do {
                uVar13 = uVar32;
                if (iVar22 != 0) {
                  uVar27 = uVar29 << 0x10 | uVar29 >> 0x10;
                  if (uVar8 <= uVar31 && uVar31 != uVar35) {
                    uVar27 = uVar29;
                  }
                  uVar13 = (ulong)((int)uVar32 + 1);
                  *(uint *)((long)local_188.m_p + uVar32 * 4) = uVar27;
                }
                if (local_1b0 >> 0xb < uVar28) break;
                uVar29 = uVar29 + 0x800;
                iVar22 = iVar22 + -0x800;
                uVar31 = uVar31 + 0x800;
                bVar33 = uVar28 < 0x1f;
                uVar32 = uVar13;
                uVar28 = uVar28 + 1;
              } while (bVar33);
            }
            if (uVar44 < uVar30) break;
            uVar25 = uVar25 + 0x20;
            iVar19 = iVar19 + -0x20;
            uVar12 = uVar12 + 0x20;
            bVar33 = uVar30 < 0x3f;
            uVar30 = uVar30 + 1;
          } while (bVar33);
        }
        if (uVar34 < uVar17) break;
        uVar24 = uVar24 + 1;
        iVar18 = iVar18 + -1;
        uVar11 = uVar11 + 1;
        bVar33 = uVar17 < 0x1f;
        uVar17 = uVar17 + 1;
      } while (bVar33);
    }
    sVar10 = (short)(uVar35 & 0x1f);
    uVar34 = (uint)(ushort)(sVar10 - 1);
    if (sVar10 == 0) {
      uVar34 = 0;
    }
    if ((ushort)uVar34 <= (ushort)(sVar10 + 1U)) {
      uVar21 = uVar8 >> 0xb;
      uVar44 = uVar8 >> 5 & 0x3f;
      sVar10 = (short)uVar44;
      uVar41 = (uint)(ushort)(sVar10 - 1);
      if (sVar10 == 0) {
        uVar41 = 0;
      }
      uVar8 = (uVar21 - 1) + (ushort)(uVar35 < 0x800);
      uVar17 = (local_1b0 * 0x10000 + (uint)uVar8 * 0x800 | uVar41 << 5) + uVar34;
      uVar11 = (uVar41 << 5 | (uint)uVar8 * 0x800) + uVar34;
      iVar18 = uVar35 - uVar11;
      do {
        local_1bc = (ushort)uVar41;
        uVar12 = uVar11;
        iVar19 = iVar18;
        uVar30 = uVar41;
        uVar24 = uVar17;
        if (local_1bc <= (ushort)(sVar10 + 1U)) {
          do {
            uVar32 = uVar13;
            uVar31 = (uint)uVar8;
            iVar22 = iVar19;
            uVar25 = uVar12;
            uVar28 = uVar24;
            if (uVar8 < 0x20 && uVar8 <= (ushort)(uVar21 + 1)) {
              do {
                uVar13 = uVar32;
                if (iVar22 != 0) {
                  uVar29 = uVar28 << 0x10 | uVar28 >> 0x10;
                  if (local_1b0 < uVar25) {
                    uVar29 = uVar28;
                  }
                  uVar13 = (ulong)((int)uVar32 + 1);
                  *(uint *)((long)local_188.m_p + uVar32 * 4) = uVar29;
                }
                if (uVar21 < uVar31) break;
                uVar28 = uVar28 + 0x800;
                iVar22 = iVar22 + -0x800;
                uVar25 = uVar25 + 0x800;
                bVar33 = uVar31 < 0x1f;
                uVar32 = uVar13;
                uVar31 = uVar31 + 1;
              } while (bVar33);
            }
            if (uVar44 < uVar30) break;
            uVar24 = uVar24 + 0x20;
            iVar19 = iVar19 + -0x20;
            uVar12 = uVar12 + 0x20;
            bVar33 = uVar30 < 0x3f;
            uVar30 = uVar30 + 1;
          } while (bVar33);
        }
        if ((uVar35 & 0x1f) < uVar34) break;
        uVar17 = uVar17 + 1;
        iVar18 = iVar18 + -1;
        uVar11 = uVar11 + 1;
        bVar33 = uVar34 < 0x1f;
        uVar34 = uVar34 + 1;
      } while (bVar33);
    }
    if ((int)uVar13 == 0) goto LAB_001ab3a0;
    pvVar1 = (void *)((long)local_188.m_p + uVar13 * 4);
    lVar20 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar20 == 0; lVar20 = lVar20 + -1) {
      }
    }
    std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_188.m_p,pvVar1,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar5,pvVar1);
    uVar32 = 0;
    bVar2 = 0;
    do {
      if (uVar32 == 0) {
        uVar34 = *local_188.m_p;
LAB_001ab1de:
        uVar21 = (ushort)(uVar34 >> 0x10);
        if ((uVar34 & 0xffff) == uVar34 >> 0x10) {
          if (local_140 < local_148) {
            uVar35 = (uint)((short)uVar34 == 0);
            sVar10 = -1;
            if (((uVar34 & 0x1f0000) == 0) && (sVar10 = -0x800, uVar34 < 0x8000000)) {
              sVar10 = (ushort)(uVar34 < 0x10000) * 0x20 + -0x20;
            }
          }
          else {
            uVar41 = ~uVar34;
            uVar35 = 1;
            if (((uVar41 & 0x1f) == 0) && (uVar35 = 0x800, (uVar41 & 0xf800) == 0)) {
              uVar35 = (uint)((uVar41 & 0x7e0) != 0) << 5;
            }
            sVar10 = -(ushort)(uVar34 >> 0x10 == 0xffff);
          }
          uVar34 = uVar35 + uVar34;
          uVar21 = uVar21 + sVar10;
        }
        pcVar7 = local_108;
        dxt1_block::get_block_colors4(pcVar7,(uint16)uVar34,uVar21);
        bVar33 = local_170->m_pParams->m_perceptual;
        puVar9 = local_98;
        puVar14 = local_f8;
        lVar20 = 0;
        uVar6 = 0;
        do {
          lVar23 = *(long *)(local_168 + lVar20 * 8);
          lVar26 = 0;
          do {
            local_138[lVar26] =
                 (lVar23 * (ulong)(pcVar7->field_0).c[lVar26] - *(long *)(puVar9 + lVar26 * 8)) *
                 (ulong)(pcVar7->field_0).c[lVar26] + *(long *)(puVar14 + lVar26 * 8);
            lVar26 = lVar26 + 1;
          } while (lVar26 != 3);
          if (bVar33 == false) {
            lVar23 = local_138[0] + local_138[1];
          }
          else {
            lVar23 = local_138[1] * 0x19 + local_138[0] * 8;
          }
          uVar6 = uVar6 + lVar23 + local_138[2];
          lVar20 = lVar20 + 1;
          pcVar7 = pcVar7 + 1;
          puVar14 = puVar14 + 0x18;
          puVar9 = puVar9 + 0x18;
        } while (lVar20 != 4);
        if (uVar6 < local_170->m_pResults->m_error) {
          local_170->m_pResults->m_low_color = (uint16)uVar34;
          local_170->m_pResults->m_high_color = uVar21;
          local_170->m_pResults->m_error = uVar6;
          if (local_170->m_pResults->m_error == 0) goto LAB_001ab39b;
          local_118._8_8_ = 0;
          local_118._0_8_ = (ulong)uVar34 & 0xffffffff0000ffff | (ulong)uVar21 << 0x10;
          bVar2 = 1;
        }
      }
      else {
        uVar34 = *(uint *)((long)local_188.m_p + uVar32 * 4);
        if (uVar34 != *(uint *)((long)local_188.m_p + (uVar32 - 1) * 4)) goto LAB_001ab1de;
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 != uVar13);
    local_190 = local_190 + -1;
  } while ((bool)(bVar2 & local_190 != 0));
LAB_001ab39b:
LAB_001ab3a0:
  if (local_188.m_p != (void *)0x0) {
    crnlib_free(local_188.m_p);
  }
  return;
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt1(vec3F low_color, vec3F high_color) {
  uint16 L0 = math::clamp<int>(low_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(low_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(low_color[2] * 32.0f, 0, 31);
  uint16 H0 = math::clamp<int>(high_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(high_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(high_color[2] * 32.0f, 0, 31);

  uint64 hist[4] = {}, D2[4][3] = {}, DD[4][3] = {};
  for (uint i = 0; i < m_pParams->m_num_pixels; i++) {
    const color_quad_u8& pixel = m_pParams->m_pPixels[i];
    uint8 s = m_pParams->m_pSelectors[i];
    hist[s]++;
    for (uint c = 0; c < 3; c++) {
      D2[s][c] += pixel[c] * 2;
      DD[s][c] += pixel[c] * pixel[c];
    }
  }
  crnlib::vector<uint> solutions(54);
  bool preserveL = hist[0] + hist[2] > hist[1] + hist[3];
  bool improved = true;

  for (uint iterations = 8; improved && iterations; iterations--) {
    improved = false;
    uint solutions_count = 0;
    for (uint16 b0 = L0 & 31, g0 = L0 >> 5 & 63, r0 = L0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++) {
      for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++) {
        for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++) {
          uint16 L = r << 11 | g << 5 | b;
          if (L != L0)
            solutions[solutions_count++] = L > H0 ? L | H0 << 16 : H0 | L << 16;
        }
      }
    }
    for (uint16 b0 = H0 & 31, g0 = H0 >> 5 & 63, r0 = H0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++) {
      for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++) {
        for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++) {
          uint16 H = r << 11 | g << 5 | b;
          if (H != H0)
            solutions[solutions_count++] = H > L0 ? H | L0 << 16 : L0 | H << 16;
        }
      }
    }
    std::sort(solutions.begin(), solutions.begin() + solutions_count);
    for (uint i = 0; i < solutions_count; i++) {
      if (i && solutions[i] == solutions[i - 1])
        continue;
      uint16 L = solutions[i] & 0xFFFF;
      uint16 H = solutions[i] >> 16;
      if (L == H) {
        L += !preserveL ? ~L & 0x1F ? 0x1 : ~L & 0xF800 ? 0x800 : ~L & 0x7E0 ? 0x20 : 0 : !L ? 0x1 : 0;
        H -= preserveL ? H & 0x1F ? 0x1 : H & 0xF800 ? 0x800 : H & 0x7E0 ? 0x20 : 0 : H == 0xFFFF ? 0x1 : 0;
      }
      color_quad_u8 block_colors[4];
      dxt1_block::get_block_colors4(block_colors, L, H);
      uint64 error = 0;
      for (uint64 s = 0, d[3]; s < 4; s++) {
        for (uint c = 0; c < 3; c++)
          d[c] = hist[s] * block_colors[s][c] * block_colors[s][c] - D2[s][c] * block_colors[s][c] + DD[s][c];
        error += m_pParams->m_perceptual ? d[0] * 8 + d[1] * 25 + d[2] : d[0] + d[1] + d[2];
      }
      if (error < m_pResults->m_error) {
        m_pResults->m_low_color = L0 = L;
        m_pResults->m_high_color = H0 = H;
        m_pResults->m_error = error;
        if (!m_pResults->m_error)
          return;
        improved = true;
      }
    }
  }
}